

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  ImVec2 *pIVar1;
  int iVar2;
  int iVar3;
  ImVec2 *pIVar4;
  int iVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float local_98;
  undefined1 auVar15 [16];
  
  if (radius <= 0.0) {
    iVar2 = (this->_Path).Size;
    iVar3 = (this->_Path).Capacity;
    if (iVar2 == iVar3) {
      iVar2 = iVar2 + 1;
      if (iVar3 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar3 / 2 + iVar3;
      }
      if (iVar2 < iVar5) {
        iVar2 = iVar5;
      }
      if (iVar3 < iVar2) {
        pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar2 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar4,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar4;
        (this->_Path).Capacity = iVar2;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    goto LAB_0012abc4;
  }
  if (0 < num_segments) {
LAB_0012ab50:
    _PathArcToN(this,center,radius,a_min,a_max,num_segments);
    return;
  }
  if (this->_Data->ArcFastRadiusCutoff < radius) {
    local_98 = ABS(a_max - a_min);
    iVar2 = _CalcCircleAutoSegmentCount(this,radius);
    fVar11 = ceilf(((float)iVar2 * local_98) / 6.2831855);
    num_segments = (int)(6.2831855 / local_98);
    if ((int)(6.2831855 / local_98) < (int)fVar11) {
      num_segments = (int)fVar11;
    }
    goto LAB_0012ab50;
  }
  fVar11 = (a_min * 48.0) / 6.2831855;
  if (a_min <= a_max) {
    fVar11 = ceilf(fVar11);
    num_segments = extraout_EDX;
  }
  else {
    if (0.0 <= fVar11) {
LAB_0012ac18:
      iVar2 = (int)fVar11;
    }
    else {
      if ((fVar11 == (float)(int)fVar11) && (!NAN(fVar11) && !NAN((float)(int)fVar11)))
      goto LAB_0012ac18;
      iVar2 = (int)fVar11 + -1;
    }
    fVar11 = (float)iVar2;
  }
  fVar17 = (a_max * 48.0) / 6.2831855;
  iVar2 = (int)fVar11;
  if (a_min <= a_max) {
    if (0.0 <= fVar17) {
LAB_0012ac83:
      iVar3 = (int)fVar17;
    }
    else {
      if ((fVar17 == (float)(int)fVar17) && (!NAN(fVar17) && !NAN((float)(int)fVar17)))
      goto LAB_0012ac83;
      iVar3 = (int)fVar17 + -1;
    }
    fVar11 = (float)iVar3;
  }
  else {
    fVar11 = ceilf(fVar17);
    num_segments = extraout_EDX_00;
  }
  iVar5 = (int)fVar11;
  iVar3 = iVar2 - iVar5;
  if (a_min <= a_max) {
    iVar3 = iVar5 - iVar2;
  }
  iVar7 = 0;
  if (0 < iVar3) {
    iVar7 = iVar3;
  }
  auVar14._0_4_ = (float)iVar5 * -3.1415927 + (float)iVar5 * -3.1415927;
  auVar14._4_4_ = (float)iVar2 * -3.1415927 + (float)iVar2 * -3.1415927;
  auVar14._8_8_ = 0;
  auVar14 = divps(auVar14,_DAT_0017d670);
  iVar9 = -(uint)(1e-05 <= ABS(a_max + auVar14._0_4_));
  iVar10 = -(uint)(1e-05 <= ABS(a_min + auVar14._4_4_));
  auVar16._4_4_ = iVar10;
  auVar16._0_4_ = iVar9;
  auVar16._8_4_ = iVar10;
  auVar16._12_4_ = iVar10;
  auVar15._8_8_ = auVar16._8_8_;
  auVar15._4_4_ = iVar9;
  auVar15._0_4_ = iVar9;
  uVar6 = movmskpd(num_segments,auVar15);
  lVar8 = (long)(int)(iVar7 + (uint)(byte)((byte)uVar6 >> 1) + (uVar6 & 1) + 1) +
          (long)(this->_Path).Size;
  iVar7 = (int)lVar8;
  if ((this->_Path).Capacity < iVar7) {
    pIVar4 = (ImVec2 *)ImGui::MemAlloc(lVar8 * 8);
    pIVar1 = (this->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar1,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar7;
  }
  if ((byte)((byte)uVar6 >> 1) != 0) {
    fVar11 = center->x;
    fVar12 = cosf(a_min);
    fVar17 = center->y;
    fVar13 = sinf(a_min);
    iVar7 = (this->_Path).Size;
    iVar9 = (this->_Path).Capacity;
    if (iVar7 == iVar9) {
      iVar7 = iVar7 + 1;
      if (iVar9 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar9 / 2 + iVar9;
      }
      if (iVar7 < iVar10) {
        iVar7 = iVar10;
      }
      if (iVar9 < iVar7) {
        pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar4,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar4;
        (this->_Path).Capacity = iVar7;
      }
    }
    pIVar1 = (this->_Path).Data + (this->_Path).Size;
    pIVar1->x = radius * fVar12 + fVar11;
    pIVar1->y = radius * fVar13 + fVar17;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  if (0 < iVar3) {
    _PathArcToFastEx(this,center,radius,iVar2,iVar5,0);
  }
  if ((uVar6 & 1) == 0) {
    return;
  }
  fVar11 = center->x;
  fVar12 = cosf(a_max);
  fVar17 = center->y;
  fVar13 = sinf(a_max);
  iVar2 = (this->_Path).Size;
  iVar3 = (this->_Path).Capacity;
  if (iVar2 == iVar3) {
    iVar2 = iVar2 + 1;
    if (iVar3 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar3 / 2 + iVar3;
    }
    if (iVar2 < iVar5) {
      iVar2 = iVar5;
    }
    if (iVar3 < iVar2) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar2 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar2;
    }
  }
  pIVar1 = (this->_Path).Data + (this->_Path).Size;
  pIVar1->x = radius * fVar12 + fVar11;
  pIVar1->y = radius * fVar13 + fVar17;
LAB_0012abc4:
  (this->_Path).Size = (this->_Path).Size + 1;
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloorSigned(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloorSigned(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = ImAbs(a_min_segment_angle - a_min) >= 1e-5f;
        const bool a_emit_end = ImAbs(a_max - a_max_segment_angle) >= 1e-5f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}